

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterJoinThread(SortSubtask *pTask)

{
  undefined1 *local_20;
  void *pRet;
  SortSubtask *pSStack_10;
  int rc;
  SortSubtask *pTask_local;
  
  pRet._4_4_ = 0;
  if (pTask->pThread != (SQLiteThread *)0x0) {
    local_20 = &DAT_00000001;
    pSStack_10 = pTask;
    sqlite3ThreadJoin(pTask->pThread,&local_20);
    pRet._4_4_ = (int)local_20;
    pSStack_10->bDone = 0;
    pSStack_10->pThread = (SQLiteThread *)0x0;
  }
  return pRet._4_4_;
}

Assistant:

static int vdbeSorterJoinThread(SortSubtask *pTask){
  int rc = SQLITE_OK;
  if( pTask->pThread ){
#ifdef SQLITE_DEBUG_SORTER_THREADS
    int bDone = pTask->bDone;
#endif
    void *pRet = SQLITE_INT_TO_PTR(SQLITE_ERROR);
    vdbeSorterBlockDebug(pTask, !bDone, "enter");
    (void)sqlite3ThreadJoin(pTask->pThread, &pRet);
    vdbeSorterBlockDebug(pTask, !bDone, "exit");
    rc = SQLITE_PTR_TO_INT(pRet);
    assert( pTask->bDone==1 );
    pTask->bDone = 0;
    pTask->pThread = 0;
  }
  return rc;
}